

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O1

int re2::RE2::GlobalReplace(string *str,RE2 *re,StringPiece *rewrite)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  pointer pcVar8;
  int iVar9;
  pointer pcVar10;
  uint uVar11;
  uint uVar12;
  pointer pcVar13;
  string out;
  StringPiece vec [17];
  string local_180;
  StringPiece *local_160;
  StringPiece local_158;
  StringPiece local_148 [17];
  
  lVar4 = 8;
  do {
    *(undefined8 *)((long)local_148 + lVar4 + -8) = 0;
    *(undefined4 *)((long)&local_148[0].ptr_ + lVar4) = 0;
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x118);
  iVar9 = 0;
  uVar12 = 0;
  if (0 < (long)rewrite->length_) {
    pcVar6 = rewrite->ptr_;
    pcVar5 = pcVar6 + rewrite->length_;
    uVar12 = 0;
    do {
      if (*pcVar6 == '\\') {
        pcVar6 = pcVar6 + 1;
        uVar7 = 0xffffffcf;
        if (pcVar6 < pcVar5) {
          uVar7 = (int)*pcVar6 - 0x30;
        }
        uVar11 = uVar12;
        if ((int)uVar12 < (int)uVar7) {
          uVar11 = uVar7;
        }
        if (uVar7 < 10) {
          uVar12 = uVar11;
        }
      }
      pcVar6 = pcVar6 + 1;
    } while (pcVar6 < pcVar5);
  }
  if (uVar12 < 0x11) {
    pcVar10 = (str->_M_dataplus)._M_p;
    pcVar1 = pcVar10 + str->_M_string_length;
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    local_180._M_string_length = 0;
    local_180.field_2._M_local_buf[0] = '\0';
    if ((long)str->_M_string_length < 0) {
      iVar3 = 0;
    }
    else {
      iVar3 = 0;
      pcVar13 = pcVar10;
      local_160 = rewrite;
      pcVar8 = (pointer)0x0;
      do {
        while( true ) {
          local_158.ptr_ = (str->_M_dataplus)._M_p;
          local_158.length_ = (int)str->_M_string_length;
          bVar2 = Match(re,&local_158,(int)pcVar13 - (int)local_158.ptr_,local_158.length_,
                        UNANCHORED,local_148,uVar12 + 1);
          if (!bVar2) goto LAB_00133702;
          if (pcVar10 < local_148[0].ptr_) {
            std::__cxx11::string::append((char *)&local_180,(ulong)pcVar10);
          }
          if ((local_148[0].ptr_ == pcVar8) && (local_148[0].length_ == 0)) break;
          Rewrite(re,&local_180,local_160,local_148,uVar12 + 1);
          pcVar10 = local_148[0].ptr_ + local_148[0].length_;
          iVar3 = iVar3 + 1;
          pcVar13 = pcVar10;
          pcVar8 = pcVar10;
          if (pcVar1 < pcVar10) goto LAB_00133702;
        }
        if (pcVar10 < pcVar1) {
          std::__cxx11::string::append((char *)&local_180,(ulong)pcVar10);
        }
        pcVar10 = pcVar10 + 1;
        pcVar13 = (pointer)(ulong)((int)pcVar13 + 1);
      } while (pcVar10 <= pcVar1);
    }
LAB_00133702:
    iVar9 = 0;
    if (iVar3 != 0) {
      if (pcVar10 < pcVar1) {
        std::__cxx11::string::append((char *)&local_180,(ulong)pcVar10);
      }
      std::__cxx11::string::swap((string *)&local_180);
      iVar9 = iVar3;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p);
    }
  }
  return iVar9;
}

Assistant:

int RE2::GlobalReplace(string *str,
                      const RE2& re,
                      const StringPiece& rewrite) {
  StringPiece vec[kVecSize];
  int nvec = 1 + MaxSubmatch(rewrite);
  if (nvec > arraysize(vec))
    return false;

  const char* p = str->data();
  const char* ep = p + str->size();
  const char* lastend = NULL;
  string out;
  int count = 0;
  while (p <= ep) {
    if (!re.Match(*str, static_cast<int>(p - str->data()),
                  static_cast<int>(str->size()), UNANCHORED, vec, nvec))
      break;
    if (p < vec[0].begin())
      out.append(p, vec[0].begin() - p);
    if (vec[0].begin() == lastend && vec[0].size() == 0) {
      // Disallow empty match at end of last match: skip ahead.
      if (p < ep)
        out.append(p, 1);
      p++;
      continue;
    }
    re.Rewrite(&out, rewrite, vec, nvec);
    p = vec[0].end();
    lastend = p;
    count++;
  }

  if (count == 0)
    return 0;

  if (p < ep)
    out.append(p, ep - p);
  swap(out, *str);
  return count;
}